

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex.c
# Opt level: O1

bool_t prf_vertex_lookup(prf_node_t *node,prf_vertex_t *vertex)

{
  uint16_t uVar1;
  
  uVar1 = node->opcode;
  switch(uVar1) {
  case 0x44:
    prf_vertex_with_color_fill_vertex(node,vertex);
    break;
  case 0x45:
    prf_vertex_with_normal_fill_vertex(node,vertex);
    break;
  case 0x46:
    prf_vertex_with_normal_and_texture_fill_vertex(node,vertex);
    break;
  case 0x47:
    prf_vertex_with_texture_fill_vertex(node,vertex);
    break;
  default:
    if (uVar1 == 9) {
      prf_obsolete_vertex_with_normal_fill_vertex(node,vertex);
    }
    else {
      if (uVar1 != 8) {
        return 0;
      }
      prf_obsolete_vertex_with_color_fill_vertex(node,vertex);
    }
  }
  return 1;
}

Assistant:

bool_t
prf_vertex_lookup(
    prf_node_t * node,
    prf_vertex_t * vertex )
{
    switch ( node->opcode ) {
    case 8:
        prf_obsolete_vertex_with_color_fill_vertex( node, vertex );
        break;
    case 9:
        prf_obsolete_vertex_with_normal_fill_vertex( node, vertex );
        break;
    case 68:
        prf_vertex_with_color_fill_vertex( node, vertex );
        break;
    case 69:
        prf_vertex_with_normal_fill_vertex( node, vertex );
        break;
    case 70:
        prf_vertex_with_normal_and_texture_fill_vertex( node, vertex );
        break;
    case 71:
        prf_vertex_with_texture_fill_vertex( node, vertex );
        break;
    default:
        return FALSE;
    }
    return TRUE;
}